

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O0

void __thiscall
Assimp::DeboneProcess::ApplyTransform(DeboneProcess *this,aiMesh *mesh,aiMatrix4x4 *mat)

{
  float fVar1;
  bool bVar2;
  aiVector3D *paVar3;
  aiMatrix4x4t<float> *this_00;
  aiVector3t<float> *paVar4;
  aiVector3t<float> aVar5;
  aiVector3t<float> local_108;
  aiVector3t<float> local_f4;
  aiVector3t<float> local_e8;
  aiVector3t<float> local_d8;
  uint local_cc;
  float fStack_c8;
  uint i_2;
  float local_c0;
  aiVector3t<float> local_b4;
  uint local_a8;
  undefined1 local_a4 [4];
  uint i_1;
  aiMatrix3x3 m;
  aiMatrix4x4 mWorldIT;
  float local_38;
  uint local_24;
  uint i;
  aiMatrix4x4 *mat_local;
  aiMesh *mesh_local;
  DeboneProcess *this_local;
  
  bVar2 = aiMatrix4x4t<float>::IsIdentity(mat);
  if (!bVar2) {
    bVar2 = aiMesh::HasPositions(mesh);
    if (bVar2) {
      for (local_24 = 0; local_24 < mesh->mNumVertices; local_24 = local_24 + 1) {
        aVar5 = ::operator*(mat,mesh->mVertices + local_24);
        mWorldIT._56_8_ = aVar5._0_8_;
        local_38 = aVar5.z;
        paVar3 = mesh->mVertices + local_24;
        paVar3->x = mWorldIT.d3;
        paVar3->y = mWorldIT.d4;
        paVar3->z = local_38;
      }
    }
    bVar2 = aiMesh::HasNormals(mesh);
    if ((bVar2) || (bVar2 = aiMesh::HasTangentsAndBitangents(mesh), bVar2)) {
      memcpy(&m.c2,mat,0x40);
      this_00 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&m.c2);
      aiMatrix4x4t<float>::Transpose(this_00);
      aiMatrix3x3t<float>::aiMatrix3x3t
                ((aiMatrix3x3t<float> *)local_a4,(aiMatrix4x4t<float> *)&m.c2);
      bVar2 = aiMesh::HasNormals(mesh);
      if (bVar2) {
        for (local_a8 = 0; local_a8 < mesh->mNumVertices; local_a8 = local_a8 + 1) {
          aVar5 = ::operator*((aiMatrix3x3t<float> *)local_a4,mesh->mNormals + local_a8);
          _fStack_c8 = aVar5._0_8_;
          local_b4.x = fStack_c8;
          local_b4.y = (float)i_2;
          local_c0 = aVar5.z;
          local_b4.z = local_c0;
          _fStack_c8 = aVar5;
          paVar4 = aiVector3t<float>::Normalize(&local_b4);
          paVar3 = mesh->mNormals + local_a8;
          fVar1 = paVar4->y;
          paVar3->x = paVar4->x;
          paVar3->y = fVar1;
          paVar3->z = paVar4->z;
        }
      }
      bVar2 = aiMesh::HasTangentsAndBitangents(mesh);
      if (bVar2) {
        for (local_cc = 0; local_cc < mesh->mNumVertices; local_cc = local_cc + 1) {
          aVar5 = ::operator*((aiMatrix3x3t<float> *)local_a4,mesh->mTangents + local_cc);
          local_e8.z = aVar5.z;
          local_d8.z = local_e8.z;
          local_e8._0_8_ = aVar5._0_8_;
          local_d8.x = local_e8.x;
          local_d8.y = local_e8.y;
          local_e8 = aVar5;
          paVar4 = aiVector3t<float>::Normalize(&local_d8);
          paVar3 = mesh->mTangents;
          paVar3[local_cc].z = paVar4->z;
          fVar1 = paVar4->y;
          paVar3 = paVar3 + local_cc;
          paVar3->x = paVar4->x;
          paVar3->y = fVar1;
          aVar5 = ::operator*((aiMatrix3x3t<float> *)local_a4,mesh->mBitangents + local_cc);
          local_108._0_8_ = aVar5._0_8_;
          local_f4.x = local_108.x;
          local_f4.y = local_108.y;
          local_108.z = aVar5.z;
          local_f4.z = local_108.z;
          paVar4 = aiVector3t<float>::Normalize(&local_f4);
          paVar3 = mesh->mBitangents + local_cc;
          fVar1 = paVar4->y;
          paVar3->x = paVar4->x;
          paVar3->y = fVar1;
          paVar3->z = paVar4->z;
        }
      }
    }
  }
  return;
}

Assistant:

void DeboneProcess::ApplyTransform(aiMesh* mesh, const aiMatrix4x4& mat)const
{
    // Check whether we need to transform the coordinates at all
    if (!mat.IsIdentity()) {

        if (mesh->HasPositions()) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                mesh->mVertices[i] = mat * mesh->mVertices[i];
            }
        }
        if (mesh->HasNormals() || mesh->HasTangentsAndBitangents()) {
            aiMatrix4x4 mWorldIT = mat;
            mWorldIT.Inverse().Transpose();

            // TODO: implement Inverse() for aiMatrix3x3
            aiMatrix3x3 m = aiMatrix3x3(mWorldIT);

            if (mesh->HasNormals()) {
                for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                    mesh->mNormals[i] = (m * mesh->mNormals[i]).Normalize();
                }
            }
            if (mesh->HasTangentsAndBitangents()) {
                for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                    mesh->mTangents[i]   = (m * mesh->mTangents[i]).Normalize();
                    mesh->mBitangents[i] = (m * mesh->mBitangents[i]).Normalize();
                }
            }
        }
    }
}